

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linear_workflow.cpp
# Opt level: O0

float __thiscall ON_LinearWorkflow::PostProcessGamma(ON_LinearWorkflow *this)

{
  ON_InternalXMLImpl *this_00;
  wchar_t *path_to_node;
  float fVar1;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  ON_LinearWorkflow *local_10;
  ON_LinearWorkflow *this_local;
  
  this_00 = &this->_impl->super_ON_InternalXMLImpl;
  local_10 = this;
  path_to_node = XMLPath();
  ::ON_XMLVariant::ON_XMLVariant(&local_200,2.2);
  ON_InternalXMLImpl::GetParameter(&local_108,this_00,path_to_node,L"gamma",&local_200);
  fVar1 = ::ON_XMLVariant::operator_cast_to_float(&local_108);
  fVar1 = ClampGamma(fVar1);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  return fVar1;
}

Assistant:

float ON_LinearWorkflow::PostProcessGamma(void) const
{
  return ClampGamma(_impl->GetParameter(XMLPath(), ON_RDK_POST_PROCESS_GAMMA, 2.2f));
}